

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O0

index_t __thiscall
boost::lockfree::detail::
fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
::allocate_impl(fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                *this)

{
  bool bVar1;
  index_t iVar2;
  index_t iVar3;
  tag_t t;
  uint uVar4;
  node *pnVar5;
  runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
  *in_RDI;
  tagged_index new_pool;
  tagged_index *next_index;
  node *old_node;
  index_t index;
  tagged_index old_pool;
  undefined2 in_stack_ffffffffffffffc0;
  tagged_index in_stack_ffffffffffffffd4;
  node *pnVar6;
  tagged_index __i;
  tagged_index local_14 [5];
  
  local_14[0] = std::atomic<boost::lockfree::detail::tagged_index>::load
                          ((atomic<boost::lockfree::detail::tagged_index> *)(in_RDI + 1),
                           memory_order_consume);
  do {
    iVar2 = tagged_index::get_index(local_14);
    uVar4 = (uint)iVar2;
    iVar3 = null_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                         *)0x130287);
    if (uVar4 == iVar3) {
      return iVar2;
    }
    pnVar5 = runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
             ::nodes(in_RDI);
    pnVar5 = pnVar5 + (int)(uint)iVar2;
    pnVar6 = pnVar5;
    iVar2 = tagged_index::get_index((tagged_index *)pnVar5);
    __i = SUB84((ulong)pnVar6 >> 0x20,0);
    t = tagged_index::get_next_tag
                  ((tagged_index *)CONCAT44(uVar4,CONCAT22(iVar2,in_stack_ffffffffffffffc0)));
    tagged_index::tagged_index((tagged_index *)&stack0xffffffffffffffd4,iVar2,t);
    bVar1 = std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_weak
                      (&pnVar5->next,
                       (tagged_index *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd4)
                       ,__i,(memory_order)((ulong)in_RDI >> 0x20));
  } while (!bVar1);
  iVar2 = tagged_index::get_index(local_14);
  return iVar2;
}

Assistant:

index_t allocate_impl (void)
    {
        tagged_index old_pool = pool_.load(memory_order_consume);

        for(;;) {
            index_t index = old_pool.get_index();
            if (index == null_handle())
                return index;

            T * old_node = NodeStorage::nodes() + index;
            tagged_index * next_index = reinterpret_cast<tagged_index*>(old_node);

            tagged_index new_pool(next_index->get_index(), old_pool.get_next_tag());

            if (pool_.compare_exchange_weak(old_pool, new_pool))
                return old_pool.get_index();
        }
    }